

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  Mat *src;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  uint *puVar7;
  int iVar8;
  long lVar9;
  uint *puVar10;
  Option *pOVar11;
  int iVar12;
  long lVar13;
  uint *puVar14;
  void *pvVar15;
  long lVar16;
  uint *puVar17;
  uint uVar18;
  long lVar19;
  int ref_h;
  long lVar20;
  void *pvVar21;
  uint *puVar22;
  uint *puVar23;
  pointer pMVar24;
  int ref_w;
  int h;
  int _woffset;
  int _outw;
  int _hoffset;
  int _outh;
  int _coffset;
  int _outc;
  int _outd;
  Mat m_1;
  int _doffset;
  Mat m;
  Mat m_2;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint *local_158;
  uint *local_150;
  Option *local_148;
  uint local_140;
  uint local_13c;
  size_t local_138;
  pointer local_130;
  Mat local_128;
  long local_e0;
  uint *local_d8;
  uint local_cc;
  void *local_c8;
  int *local_c0;
  ulong local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  uint local_90;
  ulong local_88;
  Mat local_80;
  uint *local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->w;
  uVar2 = src->h;
  uVar18 = src->c;
  iVar5 = src->dims;
  local_138 = src->elemsize;
  local_130 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_15c = 0xffffffff;
  local_168 = 0xffffffff;
  local_160 = 0xffffffff;
  local_13c = 0xffffffff;
  local_d8 = (uint *)CONCAT44(local_d8._4_4_,src->d);
  local_148 = opt;
  if (this->woffset == -0xe9) {
    switch(iVar5) {
    case 1:
      puVar7 = (uint *)src[1].data;
      puVar22 = &local_168;
      lVar16 = 0xc;
      puVar17 = &local_16c;
      puVar10 = puVar7;
      goto LAB_002973f0;
    case 2:
      puVar7 = (uint *)src[1].data;
      puVar22 = &local_160;
      lVar16 = 0x10;
      puVar17 = &local_168;
      lVar9 = 0xc;
      puVar10 = &local_164;
      lVar20 = 4;
      puVar23 = &local_16c;
      puVar14 = puVar7;
      goto LAB_002973df;
    case 3:
      puVar22 = (uint *)src[1].data;
      lVar16 = 0x14;
      puVar17 = &local_160;
      lVar9 = 0x10;
      local_150 = &local_168;
      lVar20 = 0xc;
      puVar23 = &local_15c;
      lVar13 = 8;
      puVar14 = &local_164;
      lVar19 = 4;
      puVar10 = &local_16c;
      puVar7 = puVar22;
      break;
    case 4:
      puVar7 = (uint *)src[1].data;
      local_16c = *puVar7;
      local_164 = puVar7[1];
      puVar22 = puVar7 + 2;
      lVar16 = 0x1c;
      puVar17 = &local_13c;
      lVar9 = 0x18;
      local_150 = &local_160;
      lVar20 = 0x14;
      puVar23 = &local_168;
      lVar13 = 0x10;
      puVar14 = &local_15c;
      lVar19 = 0xc;
      puVar10 = &local_cc;
      break;
    default:
      goto LAB_00297ff8;
    }
    local_158 = (uint *)CONCAT44(local_158._4_4_,uVar18);
    *puVar10 = *puVar22;
    *puVar14 = *(uint *)((long)puVar7 + lVar19);
    puVar22 = &local_140;
    puVar14 = (uint *)(lVar13 + (long)puVar7);
    puVar10 = local_150;
    uVar18 = (uint)local_158;
LAB_002973df:
    *puVar23 = *puVar14;
    *puVar10 = *(uint *)((long)puVar7 + lVar20);
    puVar10 = (uint *)(lVar9 + (long)puVar7);
LAB_002973f0:
    *puVar17 = *puVar10;
    *puVar22 = *(uint *)((long)puVar7 + lVar16);
  }
  else {
    iVar12 = 0;
    iVar8 = 0;
    switch(iVar5) {
    case 1:
      iVar8 = 1;
      break;
    case 2:
      iVar8 = 2;
      break;
    case 3:
      iVar8 = 3;
      break;
    case 4:
      iVar8 = 4;
    }
    switch(src[1].dims) {
    case 1:
      iVar12 = 1;
      break;
    case 2:
      iVar12 = 1;
      break;
    case 3:
      iVar12 = src[1].elempack * src[1].c;
      break;
    case 4:
      iVar12 = src[1].elempack * src[1].c;
    }
    if (iVar8 - 1U < 4) {
      local_158 = (uint *)CONCAT44(local_158._4_4_,iVar12);
      iVar5 = (*(code *)(&DAT_00532184 + *(int *)(&DAT_00532184 + (ulong)(iVar8 - 1U) * 4)))();
      return iVar5;
    }
  }
  pMVar24 = local_130;
  sVar4 = local_138;
  switch(iVar5) {
  case 1:
    if (local_168 != uVar1) {
      Mat::create(local_130,local_168,local_138,local_148->blob_allocator);
      if (pMVar24->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar24->c * pMVar24->cstep == 0) {
        return -100;
      }
      if (sVar4 == 4) {
        copy_cut_border_image<float>(src,pMVar24,0,local_16c);
        return 0;
      }
      if (sVar4 == 2) {
        copy_cut_border_image<unsigned_short>(src,pMVar24,0,local_16c);
        return 0;
      }
      if (sVar4 == 1) {
        copy_cut_border_image<signed_char>(src,pMVar24,0,local_16c);
        return 0;
      }
      return 0;
    }
    break;
  case 2:
    if (uVar2 != local_160 || uVar1 != local_168) {
      Mat::create(local_130,local_168,local_160,local_138,local_148->blob_allocator);
      if (pMVar24->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar24->c * pMVar24->cstep == 0) {
        return -100;
      }
      if (sVar4 == 4) {
        copy_cut_border_image<float>(src,pMVar24,local_164,local_16c);
        return 0;
      }
      if (sVar4 != 2) {
        if (sVar4 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(src,pMVar24,local_164,local_16c);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(src,pMVar24,local_164,local_16c);
      return 0;
    }
    break;
  case 3:
    if (local_140 != uVar18 || (uVar2 != local_160 || uVar1 != local_168)) {
      local_9c = src->w;
      local_98 = src->h;
      local_94 = src->d;
      local_b8 = src->elemsize;
      local_c8 = (void *)((long)(int)local_15c * src->cstep * local_b8 + (long)src->data);
      local_b0 = src->elempack;
      local_a8 = src->allocator;
      local_c0 = (int *)0x0;
      local_90 = local_140;
      local_88 = ((long)local_94 * local_b8 * (long)local_98 * (long)local_9c + 0xf &
                 0xfffffffffffffff0) / local_b8;
      local_a0 = src->dims;
      if (uVar2 != local_160 || uVar1 != local_168) {
        Mat::create(local_130,local_168,local_160,local_140,local_138,local_148->blob_allocator);
        iVar5 = -100;
        if ((pMVar24->data != (void *)0x0) && ((long)pMVar24->c * pMVar24->cstep != 0)) {
          if (0 < (int)local_140) {
            local_158 = (uint *)(ulong)local_140;
            local_150 = (uint *)(long)(int)local_16c;
            local_e0 = (long)(int)local_164;
            puVar22 = (uint *)0x0;
            do {
              lVar9 = (long)local_9c;
              local_128.data = (void *)(local_88 * (long)puVar22 * local_b8 + (long)local_c8);
              local_128.refcount = (int *)0x0;
              local_128.elemsize = local_b8;
              local_128.elempack = local_b0;
              local_128.allocator = local_a8;
              local_128.w = local_9c;
              local_128.h = local_98;
              local_128.c = local_94;
              local_128.d = 1;
              local_128.dims = local_a0 + -1;
              local_128.cstep = (local_b8 * local_98 * lVar9 + 0xf & 0xfffffffffffffff0) / local_b8;
              if (local_a0 == 4) {
                local_128.cstep = local_98 * lVar9;
              }
              uVar1 = local_130->w;
              pOVar11 = (Option *)(long)(int)uVar1;
              iVar5 = local_130->h;
              local_80.elemsize = local_130->elemsize;
              pvVar21 = (void *)(local_130->cstep * (long)puVar22 * local_80.elemsize +
                                (long)local_130->data);
              local_80.elempack = local_130->elempack;
              local_80.allocator = local_130->allocator;
              local_80.refcount = (int *)0x0;
              local_80.c = local_130->d;
              local_80.d = 1;
              local_80.dims = local_130->dims + -1;
              local_80.cstep =
                   (local_80.elemsize * (long)iVar5 * (long)pOVar11 + 0xf & 0xfffffffffffffff0) /
                   local_80.elemsize;
              if (local_130->dims == 4) {
                local_80.cstep = (long)iVar5 * (long)pOVar11;
              }
              local_d8 = puVar22;
              local_80.data = pvVar21;
              local_80.w = uVar1;
              local_80.h = iVar5;
              if (local_138 == 4) {
                copy_cut_border_image<float>(&local_128,&local_80,(int)local_e0,(int)local_150);
              }
              else if (local_138 == 2) {
                copy_cut_border_image<unsigned_short>
                          (&local_128,&local_80,(int)local_e0,(int)local_150);
              }
              else if ((local_138 == 1) && (0 < iVar5)) {
                pvVar15 = (void *)((long)local_128.data +
                                  (long)(local_b8 * lVar9 * local_e0 + (long)local_150));
                iVar8 = 0;
                local_148 = pOVar11;
                do {
                  if ((int)pOVar11 < 0xc) {
                    if (0 < (int)uVar1) {
                      uVar6 = 0;
                      do {
                        *(undefined1 *)((long)pvVar21 + uVar6) =
                             *(undefined1 *)((long)pvVar15 + uVar6);
                        uVar6 = uVar6 + 1;
                      } while (uVar1 != uVar6);
                    }
                  }
                  else {
                    memcpy(pvVar21,pvVar15,(ulong)uVar1);
                    pOVar11 = local_148;
                  }
                  pvVar21 = (void *)((long)pvVar21 + (long)pOVar11);
                  pvVar15 = (void *)((long)pvVar15 + lVar9);
                  iVar8 = iVar8 + 1;
                } while (iVar8 != iVar5);
              }
              puVar22 = (uint *)((long)local_d8 + 1);
            } while (puVar22 < local_158);
          }
          goto LAB_002980fd;
        }
      }
      else {
        Mat::clone(&local_128,(__fn *)&local_c8,(void *)0x0,(int)local_c8,(void *)(ulong)local_160);
        if (pMVar24 != &local_128) {
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          piVar3 = pMVar24->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar24->allocator == (Allocator *)0x0) {
                if (pMVar24->data != (void *)0x0) {
                  free(pMVar24->data);
                }
              }
              else {
                (*pMVar24->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar24->data = local_128.data;
          pMVar24->refcount = local_128.refcount;
          pMVar24->elemsize = local_128.elemsize;
          pMVar24->elempack = local_128.elempack;
          pMVar24->allocator = local_128.allocator;
          pMVar24->dims = local_128.dims;
          pMVar24->w = local_128.w;
          pMVar24->h = local_128.h;
          pMVar24->d = local_128.d;
          pMVar24->c = local_128.c;
          pMVar24->cstep = local_128.cstep;
        }
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar24->data == (void *)0x0) || ((long)pMVar24->c * pMVar24->cstep == 0)) {
          iVar5 = -100;
        }
        else {
LAB_002980fd:
          iVar5 = 0;
        }
      }
      if (local_c0 == (int *)0x0) {
        return iVar5;
      }
      LOCK();
      *local_c0 = *local_c0 + -1;
      UNLOCK();
      if (*local_c0 != 0) {
        return iVar5;
      }
      if (local_a8 != (Allocator *)0x0) {
        (*local_a8->_vptr_Allocator[3])();
        return iVar5;
      }
LAB_00298224:
      if (local_c8 != (void *)0x0) {
        free(local_c8);
        return iVar5;
      }
      return iVar5;
    }
    goto LAB_00297789;
  case 4:
    if (local_140 != uVar18 ||
        ((uint)local_d8 != local_13c || (uVar2 != local_160 || uVar1 != local_168))) {
      local_9c = src->w;
      local_98 = src->h;
      local_94 = src->d;
      local_c8 = (void *)((long)(int)local_15c * src->cstep * local_138 + (long)src->data);
      local_b0 = src->elempack;
      local_a8 = src->allocator;
      local_c0 = (int *)0x0;
      local_b8 = local_138;
      local_90 = local_140;
      local_88 = ((long)local_94 * local_138 * (long)local_98 * (long)local_9c + 0xf &
                 0xfffffffffffffff0) / local_138;
      local_a0 = src->dims;
      if ((uint)local_d8 != local_13c || (uVar2 != local_160 || uVar1 != local_168)) {
        local_150 = (uint *)(ulong)local_13c;
        Mat::create(local_130,local_168,local_160,local_13c,local_140,local_138,
                    local_148->blob_allocator);
        iVar5 = -100;
        if ((pMVar24->data != (void *)0x0) && ((long)pMVar24->c * pMVar24->cstep != 0)) {
          if (0 < (int)local_140) {
            local_38 = (uint *)(ulong)local_140;
            local_e0 = (long)(int)local_cc;
            local_158 = (uint *)0x0;
            do {
              if (0 < (int)local_150) {
                puVar22 = (uint *)0x0;
                do {
                  local_148 = (Option *)(long)local_9c;
                  local_128.cstep = (long)local_98 * (long)local_148;
                  local_128.data =
                       (void *)((long)local_c8 +
                               ((int)puVar22 + local_e0) * local_b8 * local_128.cstep +
                               local_88 * (long)local_158 * local_b8);
                  local_128.refcount = (int *)0x0;
                  local_128.elemsize = local_b8;
                  local_128.elempack = local_b0;
                  local_128.allocator = local_a8;
                  local_128.dims = 2;
                  local_128.w = local_9c;
                  local_128.h = local_98;
                  local_128.d = 1;
                  local_128.c = 1;
                  uVar1 = pMVar24->w;
                  local_80.elemsize = pMVar24->elemsize;
                  iVar5 = pMVar24->h;
                  local_80.elempack = pMVar24->elempack;
                  local_80.cstep = (long)iVar5 * (long)(int)uVar1;
                  pvVar21 = (void *)((long)pMVar24->data +
                                    (long)puVar22 * local_80.elemsize * local_80.cstep +
                                    pMVar24->cstep * (long)local_158 * local_80.elemsize);
                  local_80.allocator = pMVar24->allocator;
                  local_80.refcount = (int *)0x0;
                  local_80.dims = 2;
                  local_80.d = 1;
                  local_80.c = 1;
                  local_d8 = puVar22;
                  local_80.data = pvVar21;
                  local_80.w = uVar1;
                  local_80.h = iVar5;
                  if (local_138 == 4) {
                    copy_cut_border_image<float>(&local_128,&local_80,local_164,local_16c);
                  }
                  else if (local_138 == 2) {
                    copy_cut_border_image<unsigned_short>(&local_128,&local_80,local_164,local_16c);
                  }
                  else if ((local_138 == 1) && (0 < iVar5)) {
                    pvVar15 = (void *)((long)local_128.data +
                                      (long)(int)local_164 * (long)local_148 * local_b8 +
                                      (long)(int)local_16c);
                    iVar8 = 0;
                    do {
                      if ((int)uVar1 < 0xc) {
                        if (0 < (int)uVar1) {
                          uVar6 = 0;
                          do {
                            *(undefined1 *)((long)pvVar21 + uVar6) =
                                 *(undefined1 *)((long)pvVar15 + uVar6);
                            uVar6 = uVar6 + 1;
                          } while (uVar1 != uVar6);
                        }
                      }
                      else {
                        memcpy(pvVar21,pvVar15,(ulong)uVar1);
                      }
                      pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar1);
                      pvVar15 = (void *)((long)pvVar15 + (long)local_148);
                      iVar8 = iVar8 + 1;
                    } while (iVar8 != iVar5);
                  }
                  puVar22 = (uint *)((long)local_d8 + 1);
                  pMVar24 = local_130;
                } while (puVar22 < local_150);
              }
              local_158 = (uint *)((long)local_158 + 1);
            } while (local_158 < local_38);
          }
          goto LAB_002981e1;
        }
      }
      else {
        Mat::clone(&local_128,(__fn *)&local_c8,(void *)0x0,(int)local_c8,(void *)(ulong)local_160);
        if (pMVar24 != &local_128) {
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          piVar3 = pMVar24->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar24->allocator == (Allocator *)0x0) {
                if (pMVar24->data != (void *)0x0) {
                  free(pMVar24->data);
                }
              }
              else {
                (*pMVar24->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar24->data = local_128.data;
          pMVar24->refcount = local_128.refcount;
          pMVar24->elemsize = local_128.elemsize;
          pMVar24->elempack = local_128.elempack;
          pMVar24->allocator = local_128.allocator;
          pMVar24->dims = local_128.dims;
          pMVar24->w = local_128.w;
          pMVar24->h = local_128.h;
          pMVar24->d = local_128.d;
          pMVar24->c = local_128.c;
          pMVar24->cstep = local_128.cstep;
        }
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar24->data == (void *)0x0) || ((long)pMVar24->c * pMVar24->cstep == 0)) {
          iVar5 = -100;
        }
        else {
LAB_002981e1:
          iVar5 = 0;
        }
      }
      if (local_c0 == (int *)0x0) {
        return iVar5;
      }
      LOCK();
      *local_c0 = *local_c0 + -1;
      UNLOCK();
      if (*local_c0 != 0) {
        return iVar5;
      }
      if (local_a8 != (Allocator *)0x0) {
        (*local_a8->_vptr_Allocator[3])();
        return iVar5;
      }
      goto LAB_00298224;
    }
LAB_00297789:
    if (local_130 != src) {
      piVar3 = src->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = local_130->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_130->allocator == (Allocator *)0x0) {
            if (local_130->data != (void *)0x0) {
              free(local_130->data);
            }
          }
          else {
            (*local_130->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar24->cstep = 0;
      pMVar24->data = (void *)0x0;
      pMVar24->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar24->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar24->elemsize + 4) = 0;
      pMVar24->dims = 0;
      pMVar24->w = 0;
      pMVar24->h = 0;
      pMVar24->d = 0;
      pMVar24->c = 0;
      piVar3 = src->refcount;
      pMVar24->data = src->data;
      pMVar24->refcount = piVar3;
      pMVar24->elemsize = src->elemsize;
      pMVar24->elempack = src->elempack;
      pMVar24->allocator = src->allocator;
      iVar5 = src->w;
      iVar8 = src->h;
      iVar12 = src->d;
      pMVar24->dims = src->dims;
      pMVar24->w = iVar5;
      pMVar24->h = iVar8;
      pMVar24->d = iVar12;
      pMVar24->c = src->c;
      pMVar24->cstep = src->cstep;
    }
  default:
    goto LAB_00297ff8;
  }
  if (local_130 == src) {
    return 0;
  }
  piVar3 = src->refcount;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  piVar3 = local_130->refcount;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_130->allocator == (Allocator *)0x0) {
        if (local_130->data != (void *)0x0) {
          free(local_130->data);
        }
      }
      else {
        (*local_130->allocator->_vptr_Allocator[3])();
      }
    }
  }
  pMVar24->cstep = 0;
  pMVar24->data = (void *)0x0;
  pMVar24->refcount = (int *)0x0;
  *(undefined8 *)((long)&pMVar24->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar24->elemsize + 4) = 0;
  pMVar24->dims = 0;
  pMVar24->w = 0;
  pMVar24->h = 0;
  pMVar24->d = 0;
  pMVar24->c = 0;
  piVar3 = src->refcount;
  pMVar24->data = src->data;
  pMVar24->refcount = piVar3;
  pMVar24->elemsize = src->elemsize;
  pMVar24->elempack = src->elempack;
  pMVar24->allocator = src->allocator;
  iVar5 = src->w;
  iVar8 = src->h;
  iVar12 = src->d;
  pMVar24->dims = src->dims;
  pMVar24->w = iVar5;
  pMVar24->h = iVar8;
  pMVar24->d = iVar12;
  pMVar24->c = src->c;
  pMVar24->cstep = src->cstep;
LAB_00297ff8:
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}